

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunction::MarkVisitKindSpecificPtrs(ScriptFunction *this,SnapshotExtractor *extractor)

{
  uint16 uVar1;
  int iVar2;
  ParseableFunctionInfo *pfi;
  FunctionBody *fb_00;
  FrameDisplay *this_00;
  ActivationObjectEx **ppAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FrameDisplay *environment;
  FunctionBody *fb;
  SnapshotExtractor *extractor_local;
  ScriptFunction *this_local;
  
  pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
  fb_00 = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
  TTD::SnapshotExtractor::MarkFunctionBody(extractor,fb_00);
  this_00 = GetEnvironment(this);
  uVar1 = FrameDisplay::GetLength(this_00);
  if (uVar1 != 0) {
    TTD::SnapshotExtractor::MarkScriptFunctionScopeInfo(extractor,this_00);
  }
  ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObjectEx__
                      ((WriteBarrierPtr *)&this->cachedScopeObj);
  if (*ppAVar3 != (ActivationObjectEx *)0x0) {
    ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObjectEx__
                        ((WriteBarrierPtr *)&this->cachedScopeObj);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppAVar3);
  }
  iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x76])();
    TTD::SnapshotExtractor::MarkVisitVar(extractor,(Var)CONCAT44(extraout_var_00,iVar2));
  }
  iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x73])();
  if (CONCAT44(extraout_var_01,iVar2) != 0) {
    iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x73])();
    TTD::SnapshotExtractor::MarkVisitVar(extractor,(Var)CONCAT44(extraout_var_02,iVar2));
  }
  return;
}

Assistant:

void ScriptFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        Js::FunctionBody* fb = TTD::JsSupport::ForceAndGetFunctionBody(this->GetParseableFunctionInfo());
        extractor->MarkFunctionBody(fb);

        Js::FrameDisplay* environment = this->GetEnvironment();
        if(environment->GetLength() != 0)
        {
            extractor->MarkScriptFunctionScopeInfo(environment);
        }

        if(this->cachedScopeObj != nullptr)
        {
            extractor->MarkVisitVar(this->cachedScopeObj);
        }

        if (this->GetComputedNameVar() != nullptr)
        {
            extractor->MarkVisitVar(this->GetComputedNameVar());
        }

        if (this->GetHomeObj() != nullptr)
        {
            extractor->MarkVisitVar(this->GetHomeObj());
        }
    }